

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::BufferCopyToImage::prepare
          (BufferCopyToImage *this,PrepareContext *context)

{
  RefData<vk::Handle<(vk::HandleType)9>_> data;
  RefData<vk::Handle<(vk::HandleType)7>_> data_00;
  RefData<vk::VkCommandBuffer_s_*> data_01;
  VkResult result;
  Context *pCVar1;
  InstanceInterface *vki_00;
  DeviceInterface *vk;
  VkPhysicalDevice physicalDevice_00;
  VkDevice device_00;
  VkQueue queue_00;
  VkCommandPool pool;
  VkDeviceSize size;
  int *piVar2;
  size_type sVar3;
  Handle<(vk::HandleType)9> *pHVar4;
  VkCommandBuffer_s **ppVVar5;
  undefined4 local_210 [2];
  VkImageMemoryBarrier barrier;
  Move<vk::VkCommandBuffer_s_*> local_1c0;
  RefData<vk::VkCommandBuffer_s_*> local_1a0;
  undefined1 local_180 [8];
  Unique<vk::VkCommandBuffer_s_*> commandBuffer;
  Move<vk::Handle<(vk::HandleType)7>_> local_158;
  RefData<vk::Handle<(vk::HandleType)7>_> local_138;
  Move<vk::Handle<(vk::HandleType)9>_> local_118;
  RefData<vk::Handle<(vk::HandleType)9>_> local_f8;
  undefined1 local_d8 [8];
  VkImageCreateInfo createInfo;
  Vector<int,_2> local_70;
  IVec2 imageSize;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *queueFamilies;
  VkCommandPool commandPool;
  VkQueue queue;
  VkDevice device;
  VkPhysicalDevice physicalDevice;
  DeviceInterface *vkd;
  InstanceInterface *vki;
  PrepareContext *context_local;
  BufferCopyToImage *this_local;
  
  pCVar1 = PrepareContext::getContext(context);
  vki_00 = Context::getInstanceInterface(pCVar1);
  pCVar1 = PrepareContext::getContext(context);
  vk = Context::getDeviceInterface(pCVar1);
  pCVar1 = PrepareContext::getContext(context);
  physicalDevice_00 = Context::getPhysicalDevice(pCVar1);
  pCVar1 = PrepareContext::getContext(context);
  device_00 = Context::getDevice(pCVar1);
  pCVar1 = PrepareContext::getContext(context);
  queue_00 = Context::getQueue(pCVar1);
  pCVar1 = PrepareContext::getContext(context);
  pool = Context::getCommandPool(pCVar1);
  pCVar1 = PrepareContext::getContext(context);
  Context::getQueueFamilies
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&imageSize,pCVar1);
  size = PrepareContext::getBufferSize(context);
  findImageSizeWxHx4((anon_unknown_0 *)&local_70,size);
  piVar2 = tcu::Vector<int,_2>::operator[](&local_70,0);
  this->m_imageWidth = *piVar2;
  piVar2 = tcu::Vector<int,_2>::operator[](&local_70,1);
  this->m_imageHeight = *piVar2;
  local_d8._0_4_ = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  createInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  createInfo._4_4_ = 0;
  createInfo.pNext._0_4_ = 0;
  createInfo.pNext._4_4_ = 1;
  createInfo.flags = 0x25;
  createInfo.imageType = this->m_imageWidth;
  createInfo.format = this->m_imageHeight;
  createInfo.extent.width = 1;
  createInfo.extent.height = 1;
  createInfo.extent.depth = 1;
  createInfo.mipLevels = 1;
  createInfo.arrayLayers = 0;
  createInfo.samples = VK_SAMPLE_COUNT_2_BIT|VK_SAMPLE_COUNT_1_BIT;
  createInfo.tiling = VK_IMAGE_TILING_OPTIMAL;
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&imageSize);
  createInfo.usage = (VkImageUsageFlags)sVar3;
  createInfo._64_8_ =
       std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&imageSize,0);
  createInfo.pQueueFamilyIndices._0_4_ = 0;
  ::vk::createImage(&local_118,vk,device_00,(VkImageCreateInfo *)local_d8,
                    (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_f8,(Move *)&local_118);
  data.deleter.m_deviceIface._0_4_ = (int)local_f8.deleter.m_deviceIface;
  data.object.m_internal = local_f8.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_f8.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device = local_f8.deleter.m_device;
  data.deleter.m_allocator._0_4_ = (int)local_f8.deleter.m_allocator;
  data.deleter.m_allocator._4_4_ = (int)((ulong)local_f8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::operator=(&this->m_dstImage,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move(&local_118);
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     (&(this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  commandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal =
       pHVar4->m_internal;
  bindImageMemory(&local_158,vki_00,vk,physicalDevice_00,device_00,
                  (VkImage)commandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                           m_pool.m_internal,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_138,(Move *)&local_158);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_138.deleter.m_deviceIface;
  data_00.object.m_internal = local_138.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_138.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device = local_138.deleter.m_device;
  data_00.deleter.m_allocator._0_4_ = (int)local_138.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_138.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)7>_>::operator=(&this->m_memory,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)7>_>::~Move(&local_158);
  barrier._64_8_ = pool;
  createBeginCommandBuffer(&local_1c0,vk,device_00,pool,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1a0,(Move *)&local_1c0);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_1a0.deleter.m_deviceIface;
  data_01.object = local_1a0.object;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_1a0.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device = local_1a0.deleter.m_device;
  data_01.deleter.m_pool.m_internal._0_4_ = (int)local_1a0.deleter.m_pool.m_internal;
  data_01.deleter.m_pool.m_internal._4_4_ = (int)(local_1a0.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_180,data_01);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_1c0);
  local_210[0] = 0x2d;
  barrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  barrier._4_4_ = 0;
  barrier.pNext._0_4_ = 0;
  barrier.pNext._4_4_ = 0x1000;
  barrier.srcAccessMask = 0;
  barrier.dstAccessMask = 7;
  barrier.oldLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  barrier.newLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     (&(this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  barrier._32_8_ = pHVar4->m_internal;
  barrier.image.m_internal._0_4_ = 1;
  barrier.image.m_internal._4_4_ = 0;
  barrier.subresourceRange.aspectMask = 1;
  barrier.subresourceRange.baseMipLevel = 0;
  barrier.subresourceRange.levelCount = 1;
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_180);
  (*vk->_vptr_DeviceInterface[0x6d])(vk,*ppVVar5,0x10000,0x1000,0,0,0,0,0,1,local_210);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_180);
  result = (*vk->_vptr_DeviceInterface[0x4a])(vk,*ppVVar5);
  ::vk::checkResult(result,"vkd.endCommandBuffer(*commandBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryPipelineBarrierTests.cpp"
                    ,0xa08);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_180);
  queueRun(vk,queue_00,*ppVVar5);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_180);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&imageSize);
  return;
}

Assistant:

void BufferCopyToImage::prepare (PrepareContext& context)
{
	const vk::InstanceInterface&	vki				= context.getContext().getInstanceInterface();
	const vk::DeviceInterface&		vkd				= context.getContext().getDeviceInterface();
	const vk::VkPhysicalDevice		physicalDevice	= context.getContext().getPhysicalDevice();
	const vk::VkDevice				device			= context.getContext().getDevice();
	const vk::VkQueue				queue			= context.getContext().getQueue();
	const vk::VkCommandPool			commandPool		= context.getContext().getCommandPool();
	const vector<deUint32>&			queueFamilies	= context.getContext().getQueueFamilies();
	const IVec2						imageSize		= findImageSizeWxHx4(context.getBufferSize());

	m_imageWidth	= imageSize[0];
	m_imageHeight	= imageSize[1];

	{
		const vk::VkImageCreateInfo	createInfo =
		{
			vk::VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,
			DE_NULL,

			0,
			vk::VK_IMAGE_TYPE_2D,
			vk::VK_FORMAT_R8G8B8A8_UNORM,
			{
				(deUint32)m_imageWidth,
				(deUint32)m_imageHeight,
				1u,
			},
			1, 1, // mipLevels, arrayLayers
			vk::VK_SAMPLE_COUNT_1_BIT,

			vk::VK_IMAGE_TILING_OPTIMAL,
			vk::VK_IMAGE_USAGE_TRANSFER_DST_BIT|vk::VK_IMAGE_USAGE_TRANSFER_SRC_BIT,
			vk::VK_SHARING_MODE_EXCLUSIVE,

			(deUint32)queueFamilies.size(),
			&queueFamilies[0],
			vk::VK_IMAGE_LAYOUT_UNDEFINED
		};

		m_dstImage = vk::createImage(vkd, device, &createInfo);
	}

	m_memory = bindImageMemory(vki, vkd, physicalDevice, device, *m_dstImage, 0);

	{
		const vk::Unique<vk::VkCommandBuffer>	commandBuffer	(createBeginCommandBuffer(vkd, device, commandPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY));
		const vk::VkImageMemoryBarrier			barrier			=
		{
			vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,
			DE_NULL,

			0,
			vk::VK_ACCESS_TRANSFER_WRITE_BIT,

			vk::VK_IMAGE_LAYOUT_UNDEFINED,
			vk::VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,

			VK_QUEUE_FAMILY_IGNORED,
			VK_QUEUE_FAMILY_IGNORED,

			*m_dstImage,
			{
				vk::VK_IMAGE_ASPECT_COLOR_BIT,
				0,	// Mip level
				1,	// Mip level count
				0,	// Layer
				1	// Layer count
			}
		};

		vkd.cmdPipelineBarrier(*commandBuffer, vk::VK_PIPELINE_STAGE_ALL_COMMANDS_BIT, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, (vk::VkDependencyFlags)0, 0, (const vk::VkMemoryBarrier*)DE_NULL, 0, (const vk::VkBufferMemoryBarrier*)DE_NULL, 1, &barrier);

		VK_CHECK(vkd.endCommandBuffer(*commandBuffer));
		queueRun(vkd, queue, *commandBuffer);
	}
}